

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

void __thiscall duckdb::PartialBlockManager::FlushPartialBlocks(PartialBlockManager *this)

{
  pointer pPVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var2 !=
        &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    pPVar1 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
             operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                         *)&p_Var2[1]._M_parent);
    (*pPVar1->_vptr_PartialBlock[2])(pPVar1,*(undefined8 *)(p_Var2 + 1));
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
  ::clear(&(this->partially_filled_blocks)._M_t);
  return;
}

Assistant:

void PartialBlockManager::FlushPartialBlocks() {
	for (auto &e : partially_filled_blocks) {
		e.second->Flush(e.first);
	}
	partially_filled_blocks.clear();
}